

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void rcpps_(PDISASM pMyDisasm)

{
  _Bool _Var1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vrcpps");
      vex_GxEx(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x02') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vrcpss");
      vex_GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    (pMyDisasm->Instruction).Category = 0x40002;
    strcpy((pMyDisasm->Instruction).Mnemonic,"rcpss");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
  }
  else {
    _Var1 = prefixes_present(pMyDisasm);
    if (_Var1) {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"rcpps");
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ rcpps_(PDISASM pMyDisasm)
{
 if (GV.EVEX.state == InUsePrefix) {
   failDecode(pMyDisasm);
 }
 else if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrcpps");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else if (GV.VEX.pp == 2) {
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vrcpss");
     #endif
     vex_GxEx(pMyDisasm);
   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========== 0xf3 */
   if (GV.PrefRepe == 1) {
       pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
       GV.MemDecoration = Arg2dword;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rcpss");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

   }
   else {
     if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
       GV.MemDecoration = Arg2_m128_xmm;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rcpps");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);

   }
 }
}